

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getExport
          (Literals *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Name name)

{
  bool bVar1;
  Export *this_00;
  Name *pNVar2;
  pointer ppVar3;
  Name NVar4;
  _Self local_60;
  _Self local_58;
  iterator iter;
  Name internalName;
  Export *export_;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name name_local;
  
  NVar4.super_IString.str._M_str = name.super_IString.str._M_len;
  NVar4.super_IString.str._M_len = (size_t)this->wasm;
  this_00 = (Export *)::wasm::Module::getExportOrNull(NVar4);
  if ((this_00 == (Export *)0x0) || (this_00->kind != Global)) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"getExport external not found");
  }
  pNVar2 = Export::getInternalName(this_00);
  iter._M_node = (_Base_ptr)(pNVar2->super_IString).str._M_len;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
       ::find(&this->globals,(key_type *)&iter);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
       ::end(&this->globals);
  bVar1 = std::operator==(&local_58,&local_60);
  if (bVar1) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"getExport internal not found");
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Literals>_>::operator->
                     (&local_58);
  Literals::Literals(__return_storage_ptr__,&ppVar3->second);
  return __return_storage_ptr__;
}

Assistant:

Literals getExport(Name name) {
    Export* export_ = wasm.getExportOrNull(name);
    if (!export_ || export_->kind != ExternalKind::Global) {
      externalInterface->trap("getExport external not found");
    }
    Name internalName = *export_->getInternalName();
    auto iter = globals.find(internalName);
    if (iter == globals.end()) {
      externalInterface->trap("getExport internal not found");
    }
    return iter->second;
  }